

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MagneticField.cpp
# Opt level: O2

void __thiscall OpenMD::MagneticField::modifyForces(MagneticField *this)

{
  Vector3d *v2;
  uint uVar1;
  AtomType *pAVar2;
  bool bVar3;
  Molecule *pMVar4;
  pointer ppAVar5;
  ulong uVar6;
  ulong uVar7;
  Atom *this_00;
  RealType RVar8;
  FixedChargeAdapter fca;
  MoleculeIterator i;
  Vector3d omega;
  Vector3d AngMomentum;
  Vector3d v;
  MultipoleAdapter ma;
  Vector3d D;
  Vector3d t;
  Vector3d r;
  Vector3d f;
  Mat3x3d I;
  Vector<double,_3U> local_90;
  RectMatrix<double,_3U,_3U> local_78;
  
  if (this->initialized == false) {
    initialize(this);
  }
  i._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&v.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&f.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&r.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&t.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&D.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&AngMomentum.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&omega.super_Vector<double,_3U>);
  SquareMatrix<double,_3>::SquareMatrix(&I.super_SquareMatrix<double,_3>);
  if (this->doMagneticField == true) {
    pMVar4 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&i);
    v2 = &this->MF;
    while (pMVar4 != (Molecule *)0x0) {
      ppAVar5 = (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppAVar5 !=
          (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_00150482;
      this_00 = (Atom *)0x0;
      while (this_00 != (Atom *)0x0) {
        pAVar2 = this_00->atomType_;
        StuntDouble::getPos((Vector3d *)&local_78,&this_00->super_StuntDouble);
        Vector<double,_3U>::operator=(&r.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_78);
        StuntDouble::getVel((Vector3d *)&local_78,&this_00->super_StuntDouble);
        Vector<double,_3U>::operator=(&v.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_78);
        fca.at_ = pAVar2;
        bVar3 = FixedChargeAdapter::isFixedCharge(&fca);
        if (bVar3) {
          RVar8 = FixedChargeAdapter::getCharge(&fca);
          cross<double>((Vector3<double> *)&ma,&v,v2);
          operator*(&local_90,(Vector<double,_3U> *)&ma,RVar8 * 23.0609);
          operator*((Vector<double,_3U> *)&local_78,&local_90,1e-05);
          Vector3<double>::operator=
                    ((Vector3<double> *)&f.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_78)
          ;
          StuntDouble::addFrc(&this_00->super_StuntDouble,(Vector3d *)&f.super_Vector<double,_3U>);
        }
        ma.at_ = pAVar2;
        bVar3 = MultipoleAdapter::isDipole(&ma);
        if (bVar3) {
          StuntDouble::getDipole((Vector3d *)&local_90,&this_00->super_StuntDouble);
          operator*((Vector<double,_3U> *)&local_78,&local_90,4.8018969509);
          Vector3<double>::operator=(&D,(Vector<double,_3U> *)&local_78);
          cross<double>((Vector3<double> *)&local_90,&v,v2);
          cross<double>((Vector3<double> *)&local_78,&D,(Vector3<double> *)&local_90);
          Vector<double,_3U>::operator=(&t.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_78)
          ;
          StuntDouble::addTrq(&this_00->super_StuntDouble,(Vector3d *)&t.super_Vector<double,_3U>);
          StuntDouble::getJ((Vector3d *)&local_78,&this_00->super_StuntDouble);
          Vector<double,_3U>::operator=
                    (&AngMomentum.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_78);
          (*(this_00->super_StuntDouble)._vptr_StuntDouble[5])(&local_78,this_00);
          RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&I,&local_78);
          if ((this_00->super_StuntDouble).linear_ == true) {
            uVar1 = (this_00->super_StuntDouble).linearAxis_;
            uVar6 = (long)(int)(uVar1 + 1) % 3 & 0xffffffff;
            uVar7 = (long)(int)(uVar1 + 2) % 3 & 0xffffffff;
            omega.super_Vector<double,_3U>.data_[uVar1] = 0.0;
            omega.super_Vector<double,_3U>.data_[uVar6] =
                 AngMomentum.super_Vector<double,_3U>.data_[uVar6] /
                 *(double *)
                  ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                  uVar6 * 0x20);
            omega.super_Vector<double,_3U>.data_[uVar7] =
                 AngMomentum.super_Vector<double,_3U>.data_[uVar7] /
                 *(double *)
                  ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                  uVar7 * 0x20);
          }
          else {
            SquareMatrix3<double>::inverse
                      ((SquareMatrix3<double> *)&local_78,(SquareMatrix3<double> *)&I);
            operator*(&local_90,&local_78,&AngMomentum.super_Vector<double,_3U>);
            Vector3<double>::operator=(&omega,&local_90);
          }
          cross<double>((Vector3<double> *)&local_90,&omega,&D);
          cross<double>((Vector3<double> *)&local_78,(Vector3<double> *)&local_90,v2);
          Vector<double,_3U>::operator=(&f.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_78)
          ;
          StuntDouble::addFrc(&this_00->super_StuntDouble,(Vector3d *)&f.super_Vector<double,_3U>);
        }
        ppAVar5 = ppAVar5 + 1;
        this_00 = (Atom *)0x0;
        if (ppAVar5 !=
            (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_00150482:
          this_00 = *ppAVar5;
        }
      }
      pMVar4 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&i);
    }
  }
  return;
}

Assistant:

void MagneticField::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;

    int l, m, n;
    RealType C;
    Vector3d v;
    Vector3d f;
    Vector3d r;
    Vector3d t;
    Vector3d D;
    Vector3d AngMomentum;
    Vector3d omega;
    Mat3x3d I;
    bool isCharge;

    if (doMagneticField) {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();
          r     = atom->getPos();
          v     = atom->getVel();

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          C *= Constants::chargeFieldConvert;

          if (isCharge) {
            f = cross(v, MF) * C * Constants::magneticFieldConvert;
            atom->addFrc(f);
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleFieldConvert;

            t = cross(D, cross(v, MF));
            atom->addTrq(t);

            AngMomentum = atom->getJ();
            I           = atom->getI();
            if (atom->isLinear()) {
              l        = atom->linearAxis();
              m        = (l + 1) % 3;
              n        = (l + 2) % 3;
              omega[l] = 0;
              omega[m] = AngMomentum[m] / I(m, m);
              omega[n] = AngMomentum[n] / I(n, n);
            } else {
              omega = I.inverse() * AngMomentum;
            }

            f = cross(cross(omega, D), MF);
            atom->addFrc(f);
          }
        }
      }
    }
  }